

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<char>::insert(QPodArrayOps<char> *this,qsizetype i,char *data,qsizetype n)

{
  char *__dest;
  GrowthPosition where;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.size = 0;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<char>).size != 0);
  local_40 = data;
  QArrayDataPointer<char>::detachAndGrow
            (&this->super_QArrayDataPointer<char>,where,n,&local_40,&local_58);
  __dest = createHole(this,where,i,n);
  memcpy(__dest,local_40,n);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, const T *data, qsizetype n)
    {
        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        DataPointer oldData;
        this->detachAndGrow(pos, n, &data, &oldData);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        ::memcpy(static_cast<void *>(where), static_cast<const void *>(data), n * sizeof(T));
    }